

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O1

void do_cmd_view_map(void)

{
  char *pcVar1;
  bool bVar2;
  uint8_t uVar3;
  int iVar4;
  wchar_t wVar5;
  uint uVar6;
  int iVar7;
  void *p;
  long lVar8;
  level_conflict *plVar9;
  level_conflict *plVar10;
  long lVar11;
  int iVar12;
  uint8_t uVar13;
  int iVar14;
  ulong uVar15;
  ui_event uVar16;
  wchar_t hgt;
  wchar_t wid;
  wchar_t cx;
  wchar_t cy;
  int local_68;
  int local_64;
  level_conflict *local_60;
  level_conflict *local_58;
  level_conflict *local_50;
  level_conflict *local_48;
  char *local_40;
  wchar_t local_38;
  wchar_t local_34;
  
  Term_get_size(&local_64,&local_68);
  screen_save();
  prt("Please wait...",L'\0',L'\0');
  Term_fresh();
  Term_clear();
  uVar3 = tile_width;
  uVar13 = tile_height;
  tile_width = '\x01';
  tile_height = '\x01';
  display_map(&local_34,&local_38);
  put_str("Hit any key to continue",Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xfffffff5');
  Term_gotoxy(local_38,local_34);
  anykey();
  pcVar1 = world->name;
  tile_height = uVar13;
  tile_width = uVar3;
  iVar4 = strcmp(pcVar1,"Hybrid Dungeon");
  if (((iVar4 != 0) && (iVar4 = strcmp(pcVar1,"Angband Dungeon"), iVar4 != 0)) &&
     (wVar5 = level_topography((int)player->place), wVar5 != L'\a')) {
    iVar4 = (int)player->place;
    do {
      plVar10 = world->levels;
      if (plVar10[iVar4].north == (char *)0x0) {
        local_48 = (level_conflict *)0x0;
      }
      else {
        local_48 = level_by_name(world,plVar10[iVar4].north);
      }
      if (plVar10[iVar4].east == (char *)0x0) {
        local_50 = (level_conflict *)0x0;
      }
      else {
        local_50 = level_by_name(world,plVar10[iVar4].east);
      }
      if (plVar10[iVar4].south == (char *)0x0) {
        local_58 = (level_conflict *)0x0;
      }
      else {
        local_58 = level_by_name(world,plVar10[iVar4].south);
      }
      if (plVar10[iVar4].west == (char *)0x0) {
        local_60 = (level_conflict *)0x0;
      }
      else {
        local_60 = level_by_name(world,plVar10[iVar4].west);
      }
      Term_fresh();
      Term_clear();
      p = mem_zalloc(100);
      *(int *)((long)p + 0x30) = iVar4;
      iVar7 = 0;
      do {
        uVar15 = 0;
        do {
          lVar8 = (long)*(int *)((long)p + uVar15 * 4);
          if (lVar8 != 0) {
            iVar12 = (int)((uVar15 & 0xffffffff) / 5);
            plVar10 = world->levels;
            iVar14 = (int)uVar15;
            uVar6 = iVar14 - 5;
            if (uVar15 < 5) {
              uVar6 = 0xffffffff;
            }
            if (((-1 < (int)uVar6) && (plVar10[lVar8].north != (char *)0x0)) &&
               (*(int *)((long)p + (ulong)uVar6 * 4) == 0)) {
              plVar9 = level_by_name(world,plVar10[lVar8].north);
              *(int *)((long)p + (ulong)uVar6 * 4) = plVar9->index;
            }
            if (((iVar14 + iVar12 * -5 != 4) && (plVar10[lVar8].east != (char *)0x0)) &&
               (*(int *)((long)p + uVar15 * 4 + 4) == 0)) {
              plVar9 = level_by_name(world,plVar10[lVar8].east);
              *(int *)((long)p + uVar15 * 4 + 4) = plVar9->index;
            }
            if (((uVar15 < 0x14) && (plVar10[lVar8].south != (char *)0x0)) &&
               (*(int *)((long)p + uVar15 * 4 + 0x14) == 0)) {
              plVar9 = level_by_name(world,plVar10[lVar8].south);
              *(int *)((long)p + uVar15 * 4 + 0x14) = plVar9->index;
            }
            uVar6 = -(uint)(iVar14 == iVar12 * 5) | iVar14 - 1U;
            if (((-1 < (int)uVar6) && (plVar10[lVar8].west != (char *)0x0)) &&
               (*(int *)((long)p + (ulong)uVar6 * 4) == 0)) {
              plVar10 = level_by_name(world,plVar10[lVar8].west);
              *(int *)((long)p + (ulong)uVar6 * 4) = plVar10->index;
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != 0x19);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 5);
      lVar8 = -0x1c2;
      uVar15 = 0;
      do {
        lVar11 = (long)*(int *)((long)p + uVar15 * 4);
        if (lVar11 != 0) {
          iVar14 = (int)((uVar15 & 0xffffffff) / 5);
          iVar12 = iVar14 * -0x5a;
          iVar7 = (int)lVar8;
          wVar5 = iVar12 + iVar7 + L'ǃ';
          uVar6 = (uint)((uVar15 & 0xffffffff) * 0xcccccccd >> 0x20) & 0xfffffffc;
          local_40 = format("Level %d",(ulong)(uint)world->levels[lVar11].depth);
          print_map_name(*(wchar_t *)((long)p + uVar15 * 4),uVar6 + L'\x01',wVar5,false);
          uVar13 = '\b';
          if (lVar8 == -0xea) {
            uVar13 = '\x01';
          }
          c_put_str(uVar13,local_40,uVar6 + L'\x02',wVar5);
          if (world->levels[*(int *)((long)p + uVar15 * 4)].east != (char *)0x0) {
            c_put_str('\x01',"   ---",uVar6 + L'\x02',iVar14 * -0x5a + iVar7 + L'ǋ');
          }
          pcVar1 = world->levels[*(int *)((long)p + uVar15 * 4)].down;
          if ((pcVar1 != (char *)0x0) &&
             ((plVar10 = level_by_name(world,pcVar1), plVar10->topography == TOP_MOUNTAINTOP ||
              (plVar10->locality != LOC_UNDERWORLD)))) {
            print_map_name(plVar10->index,uVar6 | 3,wVar5,true);
          }
          iVar12 = iVar12 + 4;
          if (world->levels[*(int *)((long)p + uVar15 * 4)].south != (char *)0x0) {
            c_put_str('\x01',"|",uVar6 + L'\x04',iVar12 + iVar7 + L'ǂ');
          }
          iVar14 = *(int *)((long)p + uVar15 * 4);
          if ((world->levels[iVar14].south != (char *)0x0) &&
             (world->levels[iVar14].down == (char *)0x0)) {
            c_put_str('\x01',"|",uVar6 | 3,iVar12 + iVar7 + L'ǂ');
          }
        }
        uVar15 = uVar15 + 1;
        lVar8 = lVar8 + 0x12;
      } while (lVar8 != 0);
      mem_free(p);
      put_str("Move keys to scroll, other input to continue",local_68 + L'\xffffffff',
              (local_64 - (local_64 + -0x28 >> 0x1f)) + -0x28 >> 1);
      uVar16 = inkey_ex();
      iVar7 = -1;
      switch(uVar16.key.code) {
      case 0x68:
switchD_001f5a77_caseD_81:
        plVar10 = local_60;
        break;
      case 0x69:
        goto switchD_001f5a77_default;
      case 0x6a:
switchD_001f5a77_caseD_80:
        plVar10 = local_58;
        break;
      case 0x6b:
switchD_001f5a77_caseD_83:
        plVar10 = local_48;
        break;
      case 0x6c:
switchD_001f5a77_caseD_82:
        plVar10 = local_50;
        break;
      default:
        switch(uVar16.key.code) {
        case 0x80:
          goto switchD_001f5a77_caseD_80;
        case 0x81:
          goto switchD_001f5a77_caseD_81;
        case 0x82:
          goto switchD_001f5a77_caseD_82;
        case 0x83:
          goto switchD_001f5a77_caseD_83;
        }
        goto switchD_001f5a77_default;
      }
      if (plVar10 == (level_conflict *)0x0) {
        iVar7 = 0;
      }
      else {
        iVar7 = plVar10->index;
      }
switchD_001f5a77_default:
      if (iVar7 == -1) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (iVar7 != 0) {
          iVar4 = iVar7;
        }
      }
    } while (bVar2);
  }
  screen_load();
  return;
}

Assistant:

void do_cmd_view_map(void)
{
	int cy, cx;
	uint8_t w, h;
	const char *prompt = "Hit any key to continue";
	/* variables for regional map */
	int wid, hgt;
	int num_down, num_across, num, centre_place, next_place;
	ui_event ke;

	//if (Term->view_map_hook) {
	//	(*(Term->view_map_hook))(Term);
	//	return;
	//}

	/* Get size */
	Term_get_size(&wid, &hgt);

	/* Get dimensions for the regional map */
	num_down = (hgt - 6) / 8;
	num_across = (wid - 24) / 20;
	num = (num_down < num_across ? num_down : num_across);

	/* Hack - limit range for now */
	num = 2;

	/* Save screen */
	screen_save();

	/* Note */
	prt("Please wait...", 0, 0);

	/* Flush */
	Term_fresh();

	/* Clear the screen */
	Term_clear();

	/* store the tile multipliers */
	w = tile_width;
	h = tile_height;
	tile_width = 1;
	tile_height = 1;

	/* Display the map */
	display_map(&cy, &cx);

	/* Show the prompt */
	put_str(prompt, Term->hgt - 1, Term->wid / 2 - strlen(prompt) / 2);

	/* Highlight the player */
	Term_gotoxy(cx, cy);

	/* Get any key */
	(void)anykey();

	/* Restore the tile multipliers */
	tile_width = w;
	tile_height = h;

	/* Show regional map only if there is wilderness */
	if (!streq(world->name, "Hybrid Dungeon") &&
		!streq(world->name, "Angband Dungeon") &&
		(level_topography(player->place) != TOP_CAVE)) {
		centre_place = player->place;
		while (true) {
			/* Get the adjacent levels */
			struct level *lev = &world->levels[centre_place];
			struct level *north = NULL;
			struct level *east = NULL;
			struct level *south = NULL;
			struct level *west = NULL;
			if (lev->north) north = level_by_name(world, lev->north);
			if (lev->east) east = level_by_name(world, lev->east);
			if (lev->south) south = level_by_name(world, lev->south);
			if (lev->west) west = level_by_name(world, lev->west);

			/* Flush */
			Term_fresh();

			/* Clear the screen */
			Term_clear();

			/* Display the regional map */
			regional_map(num, centre_place);

			/* Wait for it */
			put_str("Move keys to scroll, other input to continue",
					hgt - 1, (wid - 40) / 2);

			/* Get any key */
			ke = inkey_ex();
			next_place = -1;
			switch (ke.key.code) {
			case 'k':
			case ARROW_UP:
				next_place = north ? north->index : 0;
				break;
			case 'j':
			case ARROW_DOWN:
				next_place = south ? south->index : 0;
				break;
			case 'h':
			case ARROW_LEFT:
				next_place = west ? west->index : 0;
				break;
			case 'l':
			case ARROW_RIGHT:
				next_place = east ? east->index : 0;
				break;
			}
			if (next_place == -1)
				break;
			if (next_place)
				centre_place = next_place;
		}
	}

	/* Load screen */
	screen_load();
}